

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UChar * __thiscall
icu_63::UnicodeStringAppendable::getAppendBuffer
          (UnicodeStringAppendable *this,int32_t minCapacity,int32_t desiredCapacityHint,
          UChar *scratch,int32_t scratchCapacity,int32_t *resultCapacity)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  char16_t *pcVar4;
  int32_t oldLength;
  int32_t *resultCapacity_local;
  int32_t scratchCapacity_local;
  UChar *scratch_local;
  int32_t desiredCapacityHint_local;
  int32_t minCapacity_local;
  UnicodeStringAppendable *this_local;
  
  if ((minCapacity < 1) || (scratchCapacity < minCapacity)) {
    *resultCapacity = 0;
    this_local = (UnicodeStringAppendable *)0x0;
  }
  else {
    iVar2 = UnicodeString::length(this->str);
    if (((minCapacity <= 0x7ffffff5 - iVar2) && (desiredCapacityHint <= 0x7ffffff5 - iVar2)) &&
       (UVar1 = UnicodeString::cloneArrayIfNeeded
                          (this->str,iVar2 + minCapacity,iVar2 + desiredCapacityHint,'\x01',
                           (int32_t **)0x0,'\0'), UVar1 != '\0')) {
      iVar3 = UnicodeString::getCapacity(this->str);
      *resultCapacity = iVar3 - iVar2;
      pcVar4 = UnicodeString::getArrayStart(this->str);
      return pcVar4 + iVar2;
    }
    *resultCapacity = scratchCapacity;
    this_local = (UnicodeStringAppendable *)scratch;
  }
  return (UChar *)this_local;
}

Assistant:

UChar *
UnicodeStringAppendable::getAppendBuffer(int32_t minCapacity,
                                         int32_t desiredCapacityHint,
                                         UChar *scratch, int32_t scratchCapacity,
                                         int32_t *resultCapacity) {
  if(minCapacity < 1 || scratchCapacity < minCapacity) {
    *resultCapacity = 0;
    return NULL;
  }
  int32_t oldLength = str.length();
  if(minCapacity <= (kMaxCapacity - oldLength) &&
      desiredCapacityHint <= (kMaxCapacity - oldLength) &&
      str.cloneArrayIfNeeded(oldLength + minCapacity, oldLength + desiredCapacityHint)) {
    *resultCapacity = str.getCapacity() - oldLength;
    return str.getArrayStart() + oldLength;
  }
  *resultCapacity = scratchCapacity;
  return scratch;
}